

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O2

int * Llb_MtrFindVarOrder(Llb_Mtr_t *p)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int *piVar5;
  void *__ptr;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  
  uVar11 = p->nRows;
  piVar5 = (int *)calloc((long)(int)uVar11,4);
  __ptr = calloc((long)(int)uVar11,4);
  uVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar11) {
    uVar7 = (ulong)uVar11;
  }
  do {
    if (uVar6 == uVar7) {
      if ((int)uVar11 < 2) {
        uVar11 = 1;
      }
      uVar6 = 0;
      bVar4 = false;
      do {
        while (bVar3 = bVar4, uVar7 = uVar6, uVar11 - 1 != uVar7) {
          iVar1 = *(int *)((long)__ptr + uVar7 * 4);
          iVar2 = *(int *)((long)__ptr + uVar7 * 4 + 4);
          uVar6 = uVar7 + 1;
          bVar4 = bVar3;
          if (iVar2 < iVar1) {
            *(ulong *)(piVar5 + uVar7) =
                 CONCAT44((int)*(undefined8 *)(piVar5 + uVar7),
                          (int)((ulong)*(undefined8 *)(piVar5 + uVar7) >> 0x20));
            *(int *)((long)__ptr + uVar6 * 4 + -4) = iVar2;
            *(int *)((long)__ptr + uVar6 * 4) = iVar1;
            bVar4 = true;
          }
        }
        uVar6 = 0;
        bVar4 = false;
      } while (bVar3);
      free(__ptr);
      return piVar5;
    }
    piVar5[uVar6] = (int)uVar6;
    uVar9 = (ulong)(uint)p->nCols;
    uVar10 = uVar9;
    do {
      uVar10 = uVar10 - 1;
      if ((int)uVar9 < 1) goto LAB_00684601;
      uVar8 = (int)uVar9 - 1;
      uVar9 = (ulong)uVar8;
    } while (p->pMatrix[uVar10][uVar6] == '\0');
    *(uint *)((long)__ptr + uVar6 * 4) = uVar8;
LAB_00684601:
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

int * Llb_MtrFindVarOrder( Llb_Mtr_t * p )
{
    int * pOrder, * pLast;
    int i, k, fChanges, Temp;
    pOrder = ABC_CALLOC( int, p->nRows );
    pLast  = ABC_CALLOC( int, p->nRows );
    for ( i = 0; i < p->nRows; i++ )
    {
        pOrder[i] = i;
        for ( k = p->nCols - 1; k >= 0; k-- )
            if ( p->pMatrix[k][i] )
            {
                pLast[i] = k;
                break;
            }
    }
    do
    {
        fChanges = 0;
        for ( i = 0; i < p->nRows - 1; i++ )
            if ( pLast[i] > pLast[i+1] )
            {
                Temp = pOrder[i];
                pOrder[i] = pOrder[i+1];
                pOrder[i+1] = Temp;

                Temp = pLast[i];
                pLast[i] = pLast[i+1];
                pLast[i+1] = Temp;

                fChanges = 1;
            }
    }
    while ( fChanges );
    ABC_FREE( pLast );
    return pOrder;
}